

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tester.h
# Opt level: O0

void __thiscall
density_tests::
QueueGenericTester<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,density::default_busy_wait>>
::
add_test_case<density_tests::detail::PutUInt16<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,density::default_busy_wait>>>
          (QueueGenericTester<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,density::default_busy_wait>>
           *this)

{
  runtime_type local_18;
  QueueGenericTester<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,density::default_busy_wait>>
  *local_10;
  QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>
  *this_local;
  
  local_10 = this;
  TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>
  ::make<unsigned_short>();
  QueueGenericTester<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>_>
  ::add_test_case((QueueGenericTester<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>_>
                   *)this,&local_18,
                  detail::
                  PutUInt16<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>_>
                  ::put,detail::
                        PutUInt16<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>_>
                        ::reentrant_put,
                  detail::
                  PutUInt16<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>_>
                  ::consume,
                  detail::
                  PutUInt16<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>_>
                  ::reentrant_consume);
  TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>
  ::~TestRuntimeTime(&local_18);
  return;
}

Assistant:

void add_test_case()
        {
            using ElementType = typename PUT_CASE::ElementType;
            add_test_case(
              QUEUE::runtime_type::template make<ElementType>(),
              &PUT_CASE::put,
              &PUT_CASE::reentrant_put,
              &PUT_CASE::consume,
              &PUT_CASE::reentrant_consume);
        }